

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O0

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
::shift_out(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
            *this)

{
  ShiftMode SVar1;
  uint8_t incoming_bit;
  bool is_free_running;
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler>
  *this_local;
  
  SVar1 = MOS6522Storage::shift_mode(&this->super_MOS6522Storage);
  if ((SVar1 == OutUnderT2FreeRunning) || ((this->super_MOS6522Storage).shift_bits_remaining_ != 0))
  {
    (this->super_MOS6522Storage).registers_.shift =
         (this->super_MOS6522Storage).registers_.shift << 1 |
         (char)((int)(uint)(this->super_MOS6522Storage).registers_.shift >> 7) *
         (SVar1 == OutUnderT2FreeRunning);
    evaluate_cb2_output(this);
    (this->super_MOS6522Storage).shift_bits_remaining_ =
         (this->super_MOS6522Storage).shift_bits_remaining_ + -1;
    if ((this->super_MOS6522Storage).shift_bits_remaining_ == 0) {
      (this->super_MOS6522Storage).registers_.interrupt_flags =
           (this->super_MOS6522Storage).registers_.interrupt_flags | 4;
      reevaluate_interrupts(this);
    }
  }
  return;
}

Assistant:

void MOS6522<T>::shift_out() {
	const bool is_free_running = shift_mode() == ShiftMode::OutUnderT2FreeRunning;
	if(is_free_running || shift_bits_remaining_) {
		// Recirculate bits only if in free-running mode (?)
		const uint8_t incoming_bit = (registers_.shift >> 7) * is_free_running;
		registers_.shift = uint8_t(registers_.shift << 1) | incoming_bit;
		evaluate_cb2_output();

		--shift_bits_remaining_;
		if(!shift_bits_remaining_) {
			registers_.interrupt_flags |= InterruptFlag::ShiftRegister;
			reevaluate_interrupts();
		}
	}
}